

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Normal3<float>
pbrt::Lerp<pbrt::Normal3,float>
          (Float t,Tuple3<pbrt::Normal3,_float> *t0,Tuple3<pbrt::Normal3,_float> *t1)

{
  Normal3<float> NVar1;
  Normal3<float> NVar2;
  Normal3<float> NVar3;
  undefined4 local_18;
  undefined4 uStack_14;
  
  NVar1 = Tuple3<pbrt::Normal3,float>::operator*((Tuple3<pbrt::Normal3,float> *)t0,1.0 - t);
  NVar2 = Tuple3<pbrt::Normal3,float>::operator*((Tuple3<pbrt::Normal3,float> *)t1,t);
  local_18 = NVar1.super_Tuple3<pbrt::Normal3,_float>.x;
  uStack_14 = NVar1.super_Tuple3<pbrt::Normal3,_float>.y;
  NVar3.super_Tuple3<pbrt::Normal3,_float>.x = NVar2.super_Tuple3<pbrt::Normal3,_float>.x + local_18
  ;
  NVar3.super_Tuple3<pbrt::Normal3,_float>.y =
       NVar2.super_Tuple3<pbrt::Normal3,_float>.y + uStack_14;
  NVar3.super_Tuple3<pbrt::Normal3,_float>.z =
       NVar2.super_Tuple3<pbrt::Normal3,_float>.z + NVar1.super_Tuple3<pbrt::Normal3,_float>.z;
  return (Normal3<float>)NVar3.super_Tuple3<pbrt::Normal3,_float>;
}

Assistant:

PBRT_CPU_GPU inline auto Lerp(Float t, const Tuple3<C, T> &t0, const Tuple3<C, T> &t1) {
    return (1 - t) * t0 + t * t1;
}